

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCreateSourceAndEvent.cpp
# Opt level: O2

void anon_unknown.dwarf_1b1825::writeEvent(Session *session)

{
  __atomic_base<unsigned_long> _Var1;
  SessionWriter writer;
  allocator local_136;
  char local_135;
  allocator local_134;
  allocator local_133;
  allocator local_132;
  allocator local_131;
  string local_130;
  SessionWriter local_110;
  undefined1 local_e0 [48];
  string local_b0 [32];
  string local_90 [32];
  uint64_t local_70;
  string local_68 [32];
  string local_48 [32];
  
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  local_130._M_string_length = 0;
  local_130.field_2._M_local_buf[0] = '\0';
  binlog::SessionWriter::SessionWriter(&local_110,session,0x80,0,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  if (writeEvent::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
    local_e0._0_8_ = 0;
    local_e0._8_2_ = info;
    std::__cxx11::string::string((string *)(local_e0 + 0x10),"category",&local_131);
    std::__cxx11::string::string(local_b0,"writeEvent",&local_132);
    std::__cxx11::string::string
              (local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/binlog/TestCreateSourceAndEvent.cpp"
               ,&local_133);
    local_70 = 0x17;
    std::__cxx11::string::string(local_68,"Hello Concurrent World",&local_134);
    local_135 = '\0';
    std::__cxx11::string::string(local_48,&local_135,&local_136);
    _Var1._M_i = binlog::Session::addEventSource(local_110._session,(EventSource *)local_e0);
    binlog::EventSource::~EventSource((EventSource *)local_e0);
    LOCK();
    UNLOCK();
    writeEvent::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var1._M_i;
  }
  binlog::SessionWriter::addEvent<>
            (&local_110,(uint64_t)writeEvent::_binlog_sid.super___atomic_base<unsigned_long>._M_i,0)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_110._channel.
              super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void writeEvent(binlog::Session& session)
{
  binlog::SessionWriter writer(session, 128);

  BINLOG_CREATE_SOURCE_AND_EVENT(writer, binlog::Severity::info, category, 0, "Hello Concurrent World");
}